

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPair.c
# Opt level: O1

uint Fxu_PairHashKeyArray(Fxu_Matrix *p,int *piVarsC1,int *piVarsC2,int nVarsC1,int nVarsC2)

{
  uint uVar1;
  ulong uVar2;
  
  if (nVarsC1 < 1) {
    uVar1 = 0;
  }
  else {
    uVar2 = 0;
    uVar1 = 0;
    do {
      uVar1 = uVar1 ^ piVarsC1[uVar2] * s_Primes[uVar2 + 100];
      uVar2 = uVar2 + 1;
    } while ((uint)nVarsC1 != uVar2);
  }
  if (0 < nVarsC2) {
    uVar2 = 0;
    do {
      uVar1 = uVar1 ^ piVarsC2[uVar2] * s_Primes[uVar2 + 200];
      uVar2 = uVar2 + 1;
    } while ((uint)nVarsC2 != uVar2);
  }
  return uVar1;
}

Assistant:

unsigned Fxu_PairHashKeyArray( Fxu_Matrix * p, int piVarsC1[], int piVarsC2[], int nVarsC1, int nVarsC2 )
{
    int Offset1 = 100, Offset2 = 200, i;
    unsigned Key;
    // compute the hash key
    Key = 0;
    for ( i = 0; i < nVarsC1; i++ )
        Key ^= s_Primes[Offset1+i] * piVarsC1[i];
    for ( i = 0; i < nVarsC2; i++ )
        Key ^= s_Primes[Offset2+i] * piVarsC2[i];
    return Key;
}